

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

void PrintIndented(ExpressionGraphContext *ctx,InplaceStr name,TypeBase *type,char *format,...)

{
  char *str;
  char *pcVar1;
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_f8;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b0 = in_R9;
  PrintIndent(ctx);
  if (name.begin != name.end) {
    OutputContext::Print(ctx->output,name.begin,(int)name.end - (int)name.begin);
    OutputContext::Print(ctx->output,": ",2);
  }
  if (type != (TypeBase *)0x0) {
    str = (type->name).begin;
    pcVar1 = (type->name).end;
    if (str != pcVar1) {
      OutputContext::Print(ctx->output,str,(int)pcVar1 - (int)str);
      OutputContext::Print(ctx->output," ",1);
    }
  }
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &args[0].overflow_arg_area;
  local_f8.gp_offset = 0x28;
  local_f8.fp_offset = 0x30;
  OutputContext::Print(ctx->output,format,&local_f8);
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintIndented(ExpressionGraphContext &ctx, InplaceStr name, TypeBase *type, const char *format, ...)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(type && !type->name.empty())
	{
		ctx.output.Print(type->name.begin, unsigned(type->name.end - type->name.begin));
		ctx.output.Print(" ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	ctx.output.Print("\n");
}